

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmq.c
# Opt level: O3

int nni_lmq_put(nni_lmq *lmq,nng_msg *msg)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  
  uVar1 = lmq->lmq_len;
  iVar3 = 8;
  if (uVar1 < lmq->lmq_cap) {
    sVar2 = lmq->lmq_put;
    lmq->lmq_msgs[sVar2] = msg;
    lmq->lmq_len = uVar1 + 1;
    lmq->lmq_put = sVar2 + 1 & lmq->lmq_mask;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
nni_lmq_put(nni_lmq *lmq, nng_msg *msg)
{
	if (lmq->lmq_len >= lmq->lmq_cap) {
		return (NNG_EAGAIN);
	}
	lmq->lmq_msgs[lmq->lmq_put++] = msg;
	lmq->lmq_len++;
	lmq->lmq_put &= lmq->lmq_mask;
	return (0);
}